

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

idx_t __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentIndex
          (SegmentTree<duckdb::ColumnSegment,_false> *this,SegmentLock *l,idx_t row_number)

{
  unsigned_long params;
  bool bVar1;
  reference pvVar2;
  pointer pCVar3;
  InternalException *this_00;
  idx_t max_depth;
  unsigned_long in_R8;
  unsigned_long in_R9;
  string *msg;
  allocator local_f9;
  idx_t segment_index;
  string local_f0;
  string error;
  Exception local_b0 [2];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  bVar1 = TryGetSegmentIndex(this,l,row_number,&segment_index);
  if (bVar1) {
    return segment_index;
  }
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string
            ((string *)local_b0,"Attempting to find row number \"%lld\" in %lld nodes\n",&local_f9);
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (&local_f0,local_b0,(string *)row_number,
             (long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,in_R8);
  ::std::__cxx11::string::operator=((string *)&error,(string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)local_b0);
  for (msg = (string *)0x0;
      msg < (string *)
            ((long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
      msg = (string *)((long)&(msg->_M_dataplus)._M_p + 1)) {
    ::std::__cxx11::string::string(local_50,"Node %lld: Start %lld, Count %lld",&local_f9);
    pvVar2 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::get<true>
                       (&this->nodes,(size_type)msg);
    params = pvVar2->row_start;
    pvVar2 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::get<true>
                       (&this->nodes,(size_type)msg);
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&pvVar2->node);
    Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
              (&local_f0,(Exception *)local_50,msg,params,
               (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i,in_R9);
    ::std::__cxx11::string::append((string *)&error);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string(local_50);
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_f0,"Could not find node in column segment tree!\n%s%s",&local_f9);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&error);
  Exception::GetStackTrace_abi_cxx11_(&local_90,(Exception *)0x78,max_depth);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_f0,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t GetSegmentIndex(SegmentLock &l, idx_t row_number) {
		idx_t segment_index;
		if (TryGetSegmentIndex(l, row_number, segment_index)) {
			return segment_index;
		}
		string error;
		error = StringUtil::Format("Attempting to find row number \"%lld\" in %lld nodes\n", row_number, nodes.size());
		for (idx_t i = 0; i < nodes.size(); i++) {
			error += StringUtil::Format("Node %lld: Start %lld, Count %lld", i, nodes[i].row_start,
			                            nodes[i].node->count.load());
		}
		throw InternalException("Could not find node in column segment tree!\n%s%s", error, Exception::GetStackTrace());
	}